

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int UpdateLastProcessedPos(BrotliEncoderState *s)

{
  uint64_t position;
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = WrapPosition(s->last_processed_pos_);
  position = s->input_pos_;
  uVar2 = WrapPosition(position);
  s->last_processed_pos_ = position;
  return (int)(uVar2 < uVar1);
}

Assistant:

static BROTLI_BOOL UpdateLastProcessedPos(BrotliEncoderState* s) {
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint32_t wrapped_input_pos = WrapPosition(s->input_pos_);
  s->last_processed_pos_ = s->input_pos_;
  return TO_BROTLI_BOOL(wrapped_input_pos < wrapped_last_processed_pos);
}